

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprListSetSortOrder(ExprList *p,int iSortOrder,int eNulls)

{
  int iVar1;
  ExprList_item *pItem;
  int eNulls_local;
  int iSortOrder_local;
  ExprList *p_local;
  
  if (p != (ExprList *)0x0) {
    iVar1 = p->nExpr + -1;
    iSortOrder_local = iSortOrder;
    if (iSortOrder == -1) {
      iSortOrder_local = 0;
    }
    p->a[iVar1].fg.sortFlags = (u8)iSortOrder_local;
    if ((eNulls != -1) &&
       (*(ushort *)&p->a[iVar1].fg.field_0x1 = *(ushort *)&p->a[iVar1].fg.field_0x1 & 0xffdf | 0x20,
       iSortOrder_local != eNulls)) {
      p->a[iVar1].fg.sortFlags = p->a[iVar1].fg.sortFlags | 2;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListSetSortOrder(ExprList *p, int iSortOrder, int eNulls){
  struct ExprList_item *pItem;
  if( p==0 ) return;
  assert( p->nExpr>0 );

  assert( SQLITE_SO_UNDEFINED<0 && SQLITE_SO_ASC==0 && SQLITE_SO_DESC>0 );
  assert( iSortOrder==SQLITE_SO_UNDEFINED
       || iSortOrder==SQLITE_SO_ASC
       || iSortOrder==SQLITE_SO_DESC
  );
  assert( eNulls==SQLITE_SO_UNDEFINED
       || eNulls==SQLITE_SO_ASC
       || eNulls==SQLITE_SO_DESC
  );

  pItem = &p->a[p->nExpr-1];
  assert( pItem->fg.bNulls==0 );
  if( iSortOrder==SQLITE_SO_UNDEFINED ){
    iSortOrder = SQLITE_SO_ASC;
  }
  pItem->fg.sortFlags = (u8)iSortOrder;

  if( eNulls!=SQLITE_SO_UNDEFINED ){
    pItem->fg.bNulls = 1;
    if( iSortOrder!=eNulls ){
      pItem->fg.sortFlags |= KEYINFO_ORDER_BIGNULL;
    }
  }
}